

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilingHelpers.cpp
# Opt level: O1

void Js::ProfilingHelpers::ProfiledStElem
               (Var base,Var varIndex,Var value,FunctionBody *functionBody,ProfileId profileId,
               PropertyOperationFlags flags,bool didArrayAccessHelperCall,
               bool bailedOutOnArraySpecialization)

{
  Type TVar1;
  long lVar2;
  SparseArraySegmentBase *pSVar3;
  code *pcVar4;
  Var pvVar5;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  FldInfoFlags oldFlags;
  FldInfoFlags newFlags;
  uint uVar9;
  int iVar10;
  BOOL BVar11;
  undefined4 *puVar12;
  ScriptContext *scriptContext;
  JavascriptArray *pJVar13;
  JavascriptCopyOnAccessNativeIntArray *this;
  INT_PTR IVar14;
  RecyclableObject *pRVar15;
  DynamicProfileInfo *pDVar16;
  ProfileId stElemId;
  undefined6 in_register_00000082;
  undefined4 in_register_0000008c;
  Type TVar17;
  ulong uVar18;
  undefined4 uVar19;
  ulong uVar20;
  PropertyCacheOperationInfo local_93;
  anon_union_2_4_ea848c7b_for_ValueType_13 aStack_90;
  undefined1 auStack_8e [3];
  PropertyCacheOperationInfo operationInfo;
  PropertyRecordUsageCache *propertyRecordUsageCache;
  RecyclableObject *object;
  undefined8 local_78;
  Var local_70;
  JavascriptArray *local_68;
  Var local_60;
  Var local_58;
  FunctionBody *local_50;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_48;
  undefined2 uStack_46;
  undefined4 uStack_44;
  RecyclableObject *cacheOwner;
  TypeId arrayTypeId;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  FldInfoFlags local_32;
  byte local_31;
  bool isObjectWithArray;
  
  local_78 = CONCAT44(in_register_0000008c,flags);
  local_60 = value;
  if (base == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0xf1,"(base)","base");
    if (!bVar7) goto LAB_00b03ca7;
    *puVar12 = 0;
  }
  if (varIndex == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0xf2,"(varIndex)","varIndex");
    if (!bVar7) goto LAB_00b03ca7;
    *puVar12 = 0;
  }
  if (local_60 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0xf3,"(value)","value");
    if (!bVar7) goto LAB_00b03ca7;
    *puVar12 = 0;
  }
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0xf4,"(functionBody)","functionBody");
    if (!bVar7) goto LAB_00b03ca7;
    *puVar12 = 0;
  }
  if (profileId == 0xffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0xf5,"(profileId != Constants::NoProfileId)",
                                "profileId != Constants::NoProfileId");
    if (!bVar7) goto LAB_00b03ca7;
    *puVar12 = 0;
  }
  cacheOwner._4_4_ = (undefined4)CONCAT62(in_register_00000082,profileId);
  ValueType::ValueType((ValueType *)&local_34.field_0);
  local_32 = FldInfo_NoInfo;
  local_31 = bailedOutOnArraySpecialization * '@' + 1;
  bVar7 = VarIs<Js::RecyclableObject>(base);
  if (bVar7) {
    bVar7 = *base == VirtualTableInfo<Js::JavascriptArray>::Address;
  }
  else {
    bVar7 = false;
  }
  scriptContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  if (bVar7) {
    bVar8 = JavascriptOperators::SetElementMayHaveImplicitCalls(scriptContext);
    if (!bVar8) {
      pJVar13 = UnsafeVarTo<Js::JavascriptArray>(base);
      local_48.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::FromArray(Array,pJVar13,TypeIds_Array);
      local_34.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::ToLikely((ValueType *)&local_48.field_0);
      bVar7 = JavascriptArray::HasNoMissingValues(pJVar13);
      local_31 = local_31 & 0xfd | bVar7 * '\x02';
      ProfiledStElem_FastPath
                (pJVar13,varIndex,local_60,scriptContext,(PropertyOperationFlags)local_78,
                 (StElemInfo *)&local_34.field_0);
      bVar7 = JavascriptArray::HasNoMissingValues(pJVar13);
      local_31 = local_31 & 0xfd | ((local_31 & 2) >> 1 & ~bVar7) * '\x02';
      pDVar16 = FunctionBody::GetDynamicProfileInfo(functionBody);
      stElemId = cacheOwner._4_2_;
      goto LAB_00b03c33;
    }
    if (!bVar7) goto LAB_00b03549;
    object = (RecyclableObject *)scriptContext;
    local_58 = varIndex;
    pJVar13 = UnsafeVarTo<Js::JavascriptArray>(base);
    arrayTypeId._3_1_ = TypeIds_Undefined >> 0x18;
    cacheOwner._0_4_ = TypeIds_Array;
  }
  else {
LAB_00b03549:
    object = (RecyclableObject *)scriptContext;
    local_58 = varIndex;
    pJVar13 = JavascriptArray::GetArrayForArrayOrObjectWithArray
                        (base,(bool *)((long)&arrayTypeId + 3),(TypeId *)&cacheOwner);
  }
  if (base != (Var)0x0) {
    bVar7 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(base);
    if (bVar7) {
      this = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(base);
    }
    else {
      this = (JavascriptCopyOnAccessNativeIntArray *)0x0;
    }
    if (this != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
      JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this);
    }
  }
  local_50 = functionBody;
  if (pJVar13 == (JavascriptArray *)0x0) {
    bVar7 = TypedArrayBase::TryGetLengthForOptimizedTypedArray
                      (base,(uint32 *)&local_48.bits,(TypeId *)&cacheOwner);
    bVar6 = local_31;
    if (bVar7) {
      local_68 = (JavascriptArray *)CONCAT44(local_68._4_4_,CONCAT22(uStack_46,local_48.bits));
      lVar2 = *base;
      IVar14 = ValueType::GetVirtualTypedArrayVtable((TypeId)cacheOwner);
      aStack_90.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::FromTypeId((TypeId)cacheOwner,lVar2 == IVar14);
      local_34.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::ToLikely((ValueType *)&aStack_90.field_0);
      pvVar5 = local_60;
      bVar7 = VarIs<Js::RecyclableObject>(local_60);
      if ((ulong)pvVar5 >> 0x32 == 0 && bVar7) {
        local_31 = local_31 | 8;
      }
      goto LAB_00b03786;
    }
  }
  else {
    if (arrayTypeId._3_1_ == 1) {
      local_48.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::FromObjectArray(pJVar13);
    }
    else {
      local_48.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::FromArray(Array,pJVar13,(TypeId)cacheOwner);
    }
    local_34.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::ToLikely((ValueType *)&local_48.field_0);
    bVar7 = JavascriptArray::HasNoMissingValues(pJVar13);
    local_31 = local_31 & 0xfd | bVar7 * '\x02';
    local_68 = (JavascriptArray *)CONCAT44(local_68._4_4_,(pJVar13->super_ArrayObject).length);
    pSVar3 = (pJVar13->head).ptr;
    if (pSVar3->left != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                  ,0x134,"(head->left == 0)","head->left == 0");
      if (!bVar7) goto LAB_00b03ca7;
      *puVar12 = 0;
    }
    TVar1 = pSVar3->length;
    local_48.bits = (Type)TVar1;
    uStack_46 = (undefined2)(TVar1 >> 0x10);
LAB_00b03786:
    if (didArrayAccessHelperCall) {
      local_31 = local_31 | 8;
    }
    uVar20 = (ulong)local_58 & 0xffff000000000000;
    uVar18 = (ulong)local_58 & 0x1ffff00000000;
    local_70 = base;
    if (uVar18 != 0x1000000000000 && uVar20 == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar7) goto LAB_00b03ca7;
      *puVar12 = 0;
    }
    functionBody = local_50;
    base = local_70;
    if (uVar20 == 0x1000000000000) {
      if (uVar18 != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar7) goto LAB_00b03ca7;
        *puVar12 = 0;
      }
      uVar9 = (uint)local_58;
      if ((int)uVar9 < 0) {
        bVar6 = local_31 | 8;
      }
      else if (uVar9 < CONCAT22(uStack_46,local_48.bits)) {
        bVar6 = local_31;
        if ((pJVar13 != (JavascriptArray *)0x0) &&
           (iVar10 = (*(pJVar13->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                       super_FinalizableObject.super_IRecyclerVisitedObject.
                       _vptr_IRecyclerVisitedObject[0x77])(pJVar13,local_58), bVar6 = local_31,
           (char)iVar10 != '\0')) {
          bVar6 = local_31 | 4;
        }
      }
      else {
        bVar6 = local_31 | 0x10;
        if ((arrayTypeId._3_1_ == TypeIds_Undefined >> 0x18) && ((uint)local_68 <= uVar9)) {
          bVar6 = local_31 | 0x30;
        }
      }
    }
    else {
      bVar6 = local_31 | 8;
    }
  }
  local_31 = bVar6;
  if (base == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar7) goto LAB_00b03ca7;
    *puVar12 = 0;
  }
  if (((ulong)base & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)base & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar7) goto LAB_00b03ca7;
    *puVar12 = 0;
  }
  uVar19 = cacheOwner._4_4_;
  pvVar5 = local_58;
  TVar17 = TypeIds_FirstNumberType;
  local_68 = pJVar13;
  if ((((ulong)base & 0xffff000000000000) != 0x1000000000000) &&
     (TVar17 = TypeIds_Number, (ulong)base >> 0x32 == 0)) {
    pRVar15 = UnsafeVarTo<Js::RecyclableObject>(base);
    if (pRVar15 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar7) goto LAB_00b03ca7;
      *puVar12 = 0;
      uVar19 = cacheOwner._4_4_;
    }
    TVar17 = ((pRVar15->type).ptr)->typeId;
    functionBody = local_50;
    if ((0x57 < (int)TVar17) &&
       (BVar11 = RecyclableObject::IsExternal(pRVar15), functionBody = local_50, BVar11 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar7) goto LAB_00b03ca7;
      *puVar12 = 0;
      functionBody = local_50;
      uVar19 = cacheOwner._4_4_;
    }
  }
  pRVar15 = object;
  if ((TVar17 - TypeIds_Int8Array < 9) ||
     (bVar7 = JavascriptOperators::GetPropertyRecordUsageCache
                        (pvVar5,(ScriptContext *)object,(PropertyRecordUsageCache **)&aStack_90,
                         (RecyclableObject **)&local_48), !bVar7)) {
    JavascriptOperators::OP_SetElementI
              (base,pvVar5,local_60,(ScriptContext *)pRVar15,(PropertyOperationFlags)local_78);
  }
  else {
    propertyRecordUsageCache = (PropertyRecordUsageCache *)0x0;
    bVar7 = JavascriptOperators::GetPropertyObjectForSetElementI
                      (base,(Var)CONCAT44(uStack_44,CONCAT22(uStack_46,local_48.bits)),
                       (ScriptContext *)pRVar15,(RecyclableObject **)&propertyRecordUsageCache);
    if (!bVar7) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                  ,0x172,"(result)","result");
      if (!bVar7) {
LAB_00b03ca7:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar12 = 0;
    }
    local_93.cacheType = CacheType_None;
    local_93.slotType = SlotType_None;
    local_93.isPolymorphic = false;
    JavascriptOperators::SetElementIWithCache<true>
              (base,(RecyclableObject *)propertyRecordUsageCache,
               (RecyclableObject *)CONCAT44(uStack_44,CONCAT22(uStack_46,local_48.bits)),local_60,
               (PropertyRecordUsageCache *)CONCAT62(_auStack_8e,aStack_90.bits),
               (ScriptContext *)pRVar15,(PropertyOperationFlags)local_78,&local_93);
    oldFlags = DynamicProfileInfo::FldInfoFlagsFromCacheType(local_93.cacheType);
    local_32 = oldFlags;
    newFlags = DynamicProfileInfo::FldInfoFlagsFromSlotType(local_93.slotType);
    local_32 = DynamicProfileInfo::MergeFldInfoFlags(oldFlags,newFlags);
    functionBody = local_50;
    uVar19 = cacheOwner._4_4_;
  }
  propertyRecordUsageCache =
       (PropertyRecordUsageCache *)CONCAT62(propertyRecordUsageCache._2_6_,local_34.bits);
  bVar7 = ValueType::IsUninitialized((ValueType *)&propertyRecordUsageCache);
  if ((bVar7) && (local_32 == FldInfo_NoInfo)) {
    pDVar16 = FunctionBody::GetDynamicProfileInfo(functionBody);
    DynamicProfileInfo::RecordElementStoreAsProfiled(pDVar16,functionBody,(ProfileId)uVar19);
    return;
  }
  if (local_68 != (JavascriptArray *)0x0) {
    bVar7 = JavascriptArray::HasNoMissingValues(local_68);
    local_31 = local_31 & 0xfd | ((local_31 & 2) >> 1 & ~bVar7) * '\x02';
  }
  pDVar16 = FunctionBody::GetDynamicProfileInfo(functionBody);
  stElemId = (ProfileId)uVar19;
LAB_00b03c33:
  DynamicProfileInfo::RecordElementStore
            (pDVar16,functionBody,stElemId,(StElemInfo *)&local_34.field_0);
  return;
}

Assistant:

void ProfilingHelpers::ProfiledStElem(
        const Var base,
        const Var varIndex,
        const Var value,
        FunctionBody *const functionBody,
        const ProfileId profileId,
        const PropertyOperationFlags flags,
        bool didArrayAccessHelperCall,
        bool bailedOutOnArraySpecialization)
    {
        JIT_HELPER_REENTRANT_HEADER(ProfiledStElem);
        Assert(base);
        Assert(varIndex);
        Assert(value);
        Assert(functionBody);
        Assert(profileId != Constants::NoProfileId);

        StElemInfo stElemInfo;

        if (bailedOutOnArraySpecialization)
        {
            stElemInfo.disableAggressiveSpecialization = true;
        }

        // Only enable fast path if the javascript array is not cross site
        const bool isJsArray = !TaggedNumber::Is(base) && VirtualTableInfo<JavascriptArray>::HasVirtualTable(base);
        ScriptContext *const scriptContext = functionBody->GetScriptContext();
        const bool fastPath = isJsArray && !JavascriptOperators::SetElementMayHaveImplicitCalls(scriptContext);
        if(fastPath)
        {
            JavascriptArray *const array = UnsafeVarTo<JavascriptArray>(base);
            stElemInfo.arrayType = ValueType::FromArray(ObjectType::Array, array, TypeIds_Array).ToLikely();
            stElemInfo.createdMissingValue = array->HasNoMissingValues();

            ProfiledStElem_FastPath(array, varIndex, value, scriptContext, flags, &stElemInfo);

            stElemInfo.createdMissingValue &= !array->HasNoMissingValues();
            functionBody->GetDynamicProfileInfo()->RecordElementStore(functionBody, profileId, stElemInfo);
            return;
        }

        JavascriptArray *array;
        bool isObjectWithArray;
        TypeId arrayTypeId;
        if(isJsArray)
        {
            array = UnsafeVarTo<JavascriptArray>(base);
            isObjectWithArray = false;
            arrayTypeId = TypeIds_Array;
        }
        else
        {
            array = JavascriptArray::GetArrayForArrayOrObjectWithArray(base, &isObjectWithArray, &arrayTypeId);
        }

#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(base);
#endif

        do // while(false)
        {
            // The fast path is only for JavascriptArray and doesn't cover native arrays, objects with internal arrays, or typed
            // arrays, but we still need to profile the array

            uint32 length;
            uint32 headSegmentLength;
            if(array)
            {
                stElemInfo.arrayType =
                    (
                        isObjectWithArray
                            ? ValueType::FromObjectArray(array)
                            : ValueType::FromArray(ObjectType::Array, array, arrayTypeId)
                    ).ToLikely();
                stElemInfo.createdMissingValue = array->HasNoMissingValues();

                length = array->GetLength();
                SparseArraySegmentBase *const head = array->GetHead();
                Assert(head->left == 0);
                headSegmentLength = head->length;
            }
            else if(TypedArrayBase::TryGetLengthForOptimizedTypedArray(base, &headSegmentLength, &arrayTypeId))
            {
                length = headSegmentLength;
                bool isVirtual = (VirtualTableInfoBase::GetVirtualTable(base) == ValueType::GetVirtualTypedArrayVtable(arrayTypeId));
                stElemInfo.arrayType = ValueType::FromTypeId(arrayTypeId, isVirtual).ToLikely();
                if (!TaggedNumber::Is(value) && !JavascriptNumber::Is_NoTaggedIntCheck(value))
                {
                    // Non-number stored to a typed array. A helper call will be needed to convert the value.
                    stElemInfo.neededHelperCall = true;
                }
            }
            else
            {
                break;
            }

            if (didArrayAccessHelperCall)
            {
                stElemInfo.neededHelperCall = true;
            }

            if(!TaggedInt::Is(varIndex))
            {
                stElemInfo.neededHelperCall = true;
                break;
            }

            const int32 index = TaggedInt::ToInt32(varIndex);
            if(index < 0)
            {
                stElemInfo.neededHelperCall = true;
                break;
            }

            const uint32 offset = index;
            if(offset >= headSegmentLength)
            {
                stElemInfo.storedOutsideHeadSegmentBounds = true;
                if(!isObjectWithArray && offset >= length)
                {
                    stElemInfo.storedOutsideArrayBounds = true;
                }
                break;
            }

            if(array && array->IsMissingHeadSegmentItem(offset))
            {
                stElemInfo.filledMissingValue = true;
            }
        } while(false);

        RecyclableObject* cacheOwner;
        PropertyRecordUsageCache* propertyRecordUsageCache;
        TypeId instanceType = JavascriptOperators::GetTypeId(base);
        bool isTypedArray = (instanceType >= TypeIds_Int8Array && instanceType <= TypeIds_Float64Array);
        if (!isTypedArray && JavascriptOperators::GetPropertyRecordUsageCache(varIndex, scriptContext, &propertyRecordUsageCache, &cacheOwner))
        {
            RecyclableObject* object = nullptr;
            bool result = JavascriptOperators::GetPropertyObjectForSetElementI(base, cacheOwner, scriptContext, &object);
            Assert(result);

            PropertyCacheOperationInfo operationInfo;
            JavascriptOperators::SetElementIWithCache<true /* ReturnOperationInfo */>(base, object, cacheOwner, value, propertyRecordUsageCache, scriptContext, flags, &operationInfo);

            stElemInfo.flags = DynamicProfileInfo::FldInfoFlagsFromCacheType(operationInfo.cacheType);
            stElemInfo.flags = DynamicProfileInfo::MergeFldInfoFlags(stElemInfo.flags, DynamicProfileInfo::FldInfoFlagsFromSlotType(operationInfo.slotType));
        }
        else
        {
            JavascriptOperators::OP_SetElementI(base, varIndex, value, scriptContext, flags);
        }

        if(!stElemInfo.GetArrayType().IsUninitialized() || stElemInfo.flags != Js::FldInfo_NoInfo)
        {
            if(array)
            {
                stElemInfo.createdMissingValue &= !array->HasNoMissingValues();
            }

            functionBody->GetDynamicProfileInfo()->RecordElementStore(functionBody, profileId, stElemInfo);
            return;
        }

        functionBody->GetDynamicProfileInfo()->RecordElementStoreAsProfiled(functionBody, profileId);
        JIT_HELPER_END(ProfiledStElem);
    }